

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCreateSourceAndEvent.cpp
# Opt level: O0

void anon_unknown.dwarf_141c7d::writeEvent(Session *session)

{
  cx_string<0UL> cVar1;
  string *in_RDI;
  uint64_t _binlog_sid_v;
  SessionWriter writer;
  memory_order __b;
  memory_order __b_1;
  atomic<unsigned_long> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  uint64_t in_stack_fffffffffffffdf8;
  SessionWriter *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe18;
  Session *this;
  string *this_00;
  undefined6 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  undefined1 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe99;
  allocator in_stack_fffffffffffffe9a;
  cx_string<0UL> in_stack_fffffffffffffe9b;
  undefined4 in_stack_fffffffffffffe9c;
  SessionWriter *in_stack_fffffffffffffea0;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  undefined8 local_f0;
  undefined1 local_e8 [64];
  __atomic_base<unsigned_long> local_a8;
  string local_90 [32];
  SessionWriter local_70;
  __atomic_base<unsigned_long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<unsigned_long> *local_28;
  __int_type_conflict1 local_20;
  memory_order local_18;
  int local_14;
  __int_type_conflict1 local_10;
  atomic<unsigned_long> *local_8;
  
  this_00 = local_90;
  std::__cxx11::string::string(this_00);
  binlog::SessionWriter::SessionWriter
            (in_stack_fffffffffffffea0,
             (Session *)
             CONCAT44(in_stack_fffffffffffffe9c,
                      CONCAT13(in_stack_fffffffffffffe9b._data[0],
                               CONCAT12(in_stack_fffffffffffffe9a,
                                        CONCAT11(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98
                                                )))),
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
             (uint64_t)this_00,in_RDI);
  std::__cxx11::string::~string(local_90);
  local_28 = &writeEvent::_binlog_sid;
  local_2c = 0;
  local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_38 = writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
  local_a8 = writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
  if (writeEvent::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
    binlog::SessionWriter::session(&local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"category",(allocator *)&stack0xfffffffffffffe9f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"writeEvent",(allocator *)&stack0xfffffffffffffe9e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/binlog/TestCreateSourceAndEvent.cpp"
               ,(allocator *)&stack0xfffffffffffffe9d);
    local_f0 = 0x17;
    this = (Session *)local_e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)this,"Hello Concurrent World",(allocator *)&stack0xfffffffffffffe9c);
    cVar1 = binlog::detail::concatenated_tags<char_const(&)[23]>
                      ((char (*) [23])in_stack_fffffffffffffde8);
    in_stack_fffffffffffffe00 =
         (SessionWriter *)
         mserialize::cx_string<0UL>::data((cx_string<0UL> *)&stack0xfffffffffffffe9b);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_e8 + 0x20),(char *)in_stack_fffffffffffffe00,
               (allocator *)&stack0xfffffffffffffe9a);
    in_stack_fffffffffffffdf8 =
         binlog::Session::addEventSource
                   (this,(EventSource *)CONCAT17(cVar1._data[0],in_stack_fffffffffffffe18));
    local_a8._M_i = in_stack_fffffffffffffdf8;
    binlog::EventSource::~EventSource
              ((EventSource *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9c);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9d);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9e);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9f);
    local_8 = &writeEvent::_binlog_sid;
    local_10 = local_a8._M_i;
    local_14 = 5;
    in_stack_fffffffffffffde8 = &writeEvent::_binlog_sid;
    local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_20 = local_10;
    in_stack_fffffffffffffdf4 = local_14;
    if (local_14 == 3) {
      (in_stack_fffffffffffffde8->super___atomic_base<unsigned_long>)._M_i = local_10;
    }
    else if (local_14 == 5) {
      LOCK();
      (in_stack_fffffffffffffde8->super___atomic_base<unsigned_long>)._M_i = local_10;
      UNLOCK();
    }
    else {
      (in_stack_fffffffffffffde8->super___atomic_base<unsigned_long>)._M_i = local_10;
    }
  }
  binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[23]>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (char (*) [23])in_stack_fffffffffffffde8);
  binlog::SessionWriter::~SessionWriter((SessionWriter *)0x229899);
  return;
}

Assistant:

void writeEvent(binlog::Session& session)
{
  binlog::SessionWriter writer(session, 128);

  BINLOG_CREATE_SOURCE_AND_EVENT(writer, binlog::Severity::info, category, 0, "Hello Concurrent World");
}